

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.c
# Opt level: O3

re_status_t re_compile(re_context *ctx,char *expr,size_t exprlen,re_machine *result_machine)

{
  re_tuple *prVar1;
  uchar *puVar2;
  byte bVar3;
  int iVar4;
  bool bVar5;
  re_state_id rVar6;
  re_state_id rVar7;
  uchar *puVar8;
  byte *pbVar9;
  ulong uVar10;
  ulong uVar11;
  byte bVar12;
  char ch;
  uint uVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  re_machine new_machine;
  re_machine cur_machine;
  re_machine alter_machine;
  uchar set [32];
  anon_struct_20_3_53c8f05c group_stack [50];
  re_machine local_468;
  re_machine local_460;
  re_machine local_458;
  ulong local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  re_machine *local_420;
  re_machine arStack_418 [2];
  int aiStack_408 [246];
  
  local_420 = result_machine;
  re_reset(ctx);
  local_460.init = -1;
  local_460.final = -1;
  local_458.init = -1;
  local_458.final = -1;
  if (exprlen != 0) {
    local_450 = 0;
    do {
      bVar12 = *expr;
      if (0x5a < bVar12) {
        if (bVar12 != 0x5b) {
          if (bVar12 != 0x7c) {
            if ((bVar12 == 0x5e) && (local_460.init == -1)) {
              ch = '\x03';
              goto LAB_00219ee6;
            }
            goto switchD_00219be8_caseD_26;
          }
          re_alternate_onto(ctx,&local_458,&local_460);
          local_460.init = -1;
          local_460.final = -1;
          goto LAB_0021a18f;
        }
        local_438 = 0;
        uStack_430 = 0;
        local_448 = 0;
        uStack_440 = 0;
        pbVar16 = (byte *)expr + 1;
        uVar10 = exprlen - 1;
        if (uVar10 == 0) {
          bVar5 = false;
LAB_00219ece:
          uVar10 = 0;
        }
        else {
          bVar12 = *pbVar16;
          bVar5 = false;
          if (bVar12 == 0x5e) {
            pbVar16 = (byte *)expr + 2;
            uVar10 = exprlen - 2;
            if (uVar10 != 0) {
              bVar12 = *pbVar16;
              bVar5 = true;
              goto LAB_00219dd2;
            }
            bVar5 = true;
            pbVar9 = pbVar16;
          }
          else {
LAB_00219dd2:
            if (bVar12 == 0x5d) {
              uStack_440 = 0x20000000;
              pbVar16 = pbVar16 + 1;
              uVar10 = uVar10 - 1;
              if (uVar10 == 0) goto LAB_00219ece;
              bVar12 = *pbVar16;
            }
            if (bVar12 == 0x2d) {
              local_448 = 0x200000000000;
              pbVar16 = pbVar16 + 1;
              uVar10 = uVar10 - 1;
              if (uVar10 == 0) goto LAB_00219ece;
            }
            do {
              bVar12 = *pbVar16;
              if (bVar12 == 0x5d) goto LAB_00219fc7;
              pbVar9 = (byte *)((long)&local_448 + (ulong)(bVar12 >> 3));
              *pbVar9 = *pbVar9 | '\x01' << (bVar12 & 7);
              pbVar9 = pbVar16 + 1;
              uVar11 = uVar10 - 1;
              if (uVar11 == 0) break;
              if (*pbVar9 == 0x2d) {
                if (uVar10 == 2) {
                  pbVar16 = pbVar16 + 2;
                  goto LAB_00219ece;
                }
                bVar3 = pbVar16[2];
                uVar15 = (uint)bVar3;
                if (bVar12 < bVar3) {
                  uVar15 = (uint)bVar12;
                }
                uVar13 = (uint)bVar3;
                if (bVar3 < bVar12) {
                  uVar13 = (uint)bVar12;
                }
                do {
                  pbVar9 = (byte *)((long)&local_448 + (ulong)(uVar15 >> 3));
                  *pbVar9 = *pbVar9 | (byte)(1 << ((byte)uVar15 & 7));
                  uVar15 = uVar15 + 1;
                } while (uVar13 + 1 != uVar15);
                uVar11 = uVar10 - 3;
                pbVar9 = pbVar16 + 3;
              }
              pbVar16 = pbVar9;
              uVar10 = uVar11;
              pbVar9 = pbVar16;
            } while (uVar11 != 0);
          }
          uVar10 = 0;
          pbVar16 = pbVar9;
        }
LAB_00219fc7:
        rVar6 = re_alloc_state(ctx);
        local_468.init = rVar6;
        rVar7 = re_alloc_state(ctx);
        local_468.final = rVar7;
        prVar1 = ctx->tuple_arr + rVar6;
        if (ctx->tuple_arr[rVar6].next_state_1 == -1) {
          if ((prVar1->flags & 6) == 0) {
            prVar1->ch = '\f' - !bVar5;
          }
          prVar1->next_state_1 = rVar7;
        }
        else {
          prVar1->next_state_2 = rVar7;
        }
        puVar8 = mchalo(ctx->errctx,0x20,"regex range");
        *(undefined8 *)puVar8 = local_448;
        *(undefined8 *)(puVar8 + 8) = uStack_440;
        *(undefined8 *)(puVar8 + 0x10) = local_438;
        *(undefined8 *)(puVar8 + 0x18) = uStack_430;
        ctx->tuple_arr[rVar6].char_range = puVar8;
        exprlen = uVar10;
        expr = (char *)pbVar16;
        goto LAB_0021a03d;
      }
      switch(bVar12) {
      case 0x24:
        if (((exprlen == 1) || (((byte *)expr)[1] == 0x7c)) || (((byte *)expr)[1] == 0x29)) {
          ch = '\x04';
          goto LAB_00219ee6;
        }
      default:
switchD_00219be8_caseD_26:
LAB_00219d83:
        re_build_char(ctx,&local_468,bVar12);
LAB_0021a03d:
        if (1 < exprlen) {
          bVar12 = ((byte *)expr)[1];
          if (((ulong)bVar12 < 0x40) && ((0x80000c0000000000U >> ((ulong)bVar12 & 0x3f) & 1) != 0))
          {
            rVar6 = re_alloc_state(ctx);
            rVar7 = re_alloc_state(ctx);
            prVar1 = ctx->tuple_arr + rVar6;
            if (ctx->tuple_arr[rVar6].next_state_1 == -1) {
              if ((prVar1->flags & 6) == 0) {
                prVar1->ch = '\x01';
              }
              prVar1->next_state_1 = local_468.init;
            }
            else {
              prVar1->next_state_2 = local_468.init;
            }
            lVar14 = (long)local_468.final;
            prVar1 = ctx->tuple_arr + lVar14;
            if (ctx->tuple_arr[lVar14].next_state_1 == -1) {
              if ((prVar1->flags & 6) == 0) {
                prVar1->ch = '\x01';
              }
              prVar1->next_state_1 = rVar7;
            }
            else {
              prVar1->next_state_2 = rVar7;
            }
            if (bVar12 == 0x3f) {
LAB_0021a0fc:
              prVar1 = ctx->tuple_arr + rVar6;
              if (ctx->tuple_arr[rVar6].next_state_1 == -1) {
                if ((prVar1->flags & 6) == 0) {
                  prVar1->ch = '\x01';
                }
                prVar1->next_state_1 = rVar7;
              }
              else {
                prVar1->next_state_2 = rVar7;
              }
            }
            else {
              prVar1 = ctx->tuple_arr + lVar14;
              if (ctx->tuple_arr[lVar14].next_state_1 == -1) {
                if ((prVar1->flags & 6) == 0) {
                  prVar1->ch = '\x01';
                }
                prVar1->next_state_1 = local_468.init;
              }
              else {
                prVar1->next_state_2 = local_468.init;
              }
              if (bVar12 != 0x2b) goto LAB_0021a0fc;
            }
            pbVar16 = (byte *)expr + 1;
            local_468.final = rVar7;
            local_468.init = rVar6;
            if (exprlen - 1 < 2) {
              exprlen = 1;
              expr = (char *)pbVar16;
            }
            else {
              pbVar9 = (byte *)expr + (exprlen - 1);
              exprlen = exprlen - 1;
              do {
                expr = (char *)pbVar16;
                if ((0x3f < (ulong)pbVar16[1]) ||
                   ((0x80000c0000000000U >> ((ulong)pbVar16[1] & 0x3f) & 1) == 0))
                goto LAB_0021a179;
                pbVar16 = pbVar16 + 1;
                exprlen = exprlen - 1;
              } while (1 < exprlen);
              exprlen = 1;
              expr = (char *)pbVar9;
            }
          }
        }
LAB_0021a179:
        re_concat_onto(ctx,&local_460,&local_468);
        break;
      case 0x25:
        exprlen = exprlen - 1;
        if (exprlen == 0) goto LAB_0021a20b;
        expr = (char *)((byte *)expr + 1);
        bVar12 = *expr;
        if (0x56 < bVar12) {
          if (bVar12 == 0x57) {
            bVar12 = 8;
          }
          else {
            if (bVar12 == 0x62) {
              ch = '\t';
              goto LAB_00219ee6;
            }
            if (bVar12 != 0x77) goto switchD_00219d3b_caseD_3a;
            bVar12 = 7;
          }
          goto LAB_00219d83;
        }
        switch(bVar12) {
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
          rVar6 = re_alloc_state(ctx);
          local_468.init = rVar6;
          rVar7 = re_alloc_state(ctx);
          local_468.final = rVar7;
          prVar1 = ctx->tuple_arr + rVar6;
          if (ctx->tuple_arr[rVar6].next_state_1 == -1) {
            if ((prVar1->flags & 6) == 0) {
              prVar1->ch = bVar12 - 0x24;
            }
            prVar1->next_state_1 = rVar7;
          }
          else {
            prVar1->next_state_2 = rVar7;
          }
          goto LAB_0021a03d;
        default:
switchD_00219d3b_caseD_3a:
          goto LAB_00219d83;
        case 0x3c:
          ch = '\x05';
          break;
        case 0x3e:
          ch = '\x06';
          break;
        case 0x42:
          ch = '\n';
        }
LAB_00219ee6:
        re_build_char(ctx,&local_468,ch);
        re_concat_onto(ctx,&local_460,&local_468);
        break;
      case 0x28:
        if (0x32 < local_450) {
          return RE_STATUS_GROUP_NESTING_TOO_DEEP;
        }
        *(re_machine *)((long)arStack_418 + local_450 * 0x14) = local_460;
        *(re_machine *)((long)arStack_418 + local_450 * 0x14 + 8) = local_458;
        iVar4 = ctx->cur_group;
        aiStack_408[local_450 * 5] = iVar4;
        ctx->cur_group = iVar4 + 1;
        local_450 = local_450 + 1;
        local_460.init = -1;
        local_460.final = -1;
        local_458.init = -1;
        local_458.final = -1;
        break;
      case 0x29:
        if (local_450 != 0) {
          uVar10 = local_450 - 1;
          re_alternate_onto(ctx,&local_458,&local_460);
          iVar4 = aiStack_408[uVar10 * 5];
          local_450 = uVar10;
          rVar6 = re_alloc_state(ctx);
          local_468.init = rVar6;
          rVar7 = re_alloc_state(ctx);
          local_468.final = rVar7;
          prVar1 = ctx->tuple_arr + rVar6;
          if (ctx->tuple_arr[rVar6].next_state_1 == -1) {
            if ((prVar1->flags & 6) == 0) {
              prVar1->ch = '\x01';
            }
            prVar1->next_state_1 = local_458.init;
          }
          else {
            prVar1->next_state_2 = local_458.init;
          }
          prVar1 = ctx->tuple_arr + local_458.final;
          if (ctx->tuple_arr[local_458.final].next_state_1 == -1) {
            if ((prVar1->flags & 6) == 0) {
              prVar1->ch = '\x01';
            }
            prVar1->next_state_1 = rVar7;
          }
          else {
            prVar1->next_state_2 = rVar7;
          }
          puVar2 = &ctx->tuple_arr[rVar6].flags;
          *puVar2 = *puVar2 | 2;
          puVar2 = &ctx->tuple_arr[rVar7].flags;
          *puVar2 = *puVar2 | 4;
          ctx->tuple_arr[rVar6].ch = (char)iVar4;
          ctx->tuple_arr[rVar7].ch = (char)iVar4;
          local_460 = *(re_machine *)((long)arStack_418 + uVar10 * 0x14);
          local_458 = *(re_machine *)((long)arStack_418 + uVar10 * 0x14 + 8);
          goto LAB_0021a03d;
        }
        local_450 = 0;
        break;
      case 0x2e:
        bVar12 = 2;
        goto LAB_00219d83;
      }
LAB_0021a18f:
      expr = (char *)((byte *)expr + 1);
      exprlen = exprlen - 1;
    } while (exprlen != 0);
  }
LAB_0021a20b:
  re_alternate_onto(ctx,&local_458,&local_460);
  *local_420 = local_458;
  return RE_STATUS_SUCCESS;
}

Assistant:

static re_status_t re_compile(re_context *ctx,
                              const char *expr, size_t exprlen,
                              re_machine *result_machine)
{
    re_machine cur_machine;
    re_machine alter_machine;
    re_machine new_machine;
    size_t group_stack_level;
    struct
    {
        re_machine old_cur;
        re_machine old_alter;
        int group_id;
    } group_stack[50];

    /* reset everything */
    re_reset(ctx);

    /* start out with no current machine and no alternate machine */
    re_build_null_machine(ctx, &cur_machine);
    re_build_null_machine(ctx, &alter_machine);

    /* nothing on the stack yet */
    group_stack_level = 0;

    /* loop until we run out of expression to parse */
    for ( ; exprlen != 0 ; ++expr, --exprlen)
    {
        switch(*expr)
        {
        case '^':
            /*
             *   beginning of line - if we're not at the beginning of the
             *   current expression (i.e., we already have some
             *   concatentations accumulated), treat it as an ordinary
             *   character 
             */
            if (!re_is_machine_null(ctx, &cur_machine))
                goto normal_char;

            /* build a new start-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_BEGIN);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;

        case '$':
            /*
             *   End of line specifier - if there's anything left after
             *   the '$' other than a close parens or alternation
             *   specifier, great it as a normal character 
             */
            if (exprlen > 1
                && (*(expr+1) != ')' && *(expr+1) != '|'))
                goto normal_char;

            /* build a new end-of-text recognizer */
            re_build_char(ctx, &new_machine, RE_TEXT_END);

            /* 
             *   concatenate it onto the string - note that this can't
             *   have any postfix operators 
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
            
        case '(':
            /* 
             *   Add a nesting level.  Push the current machine and
             *   alternate machines onto the group stack, and clear
             *   everything out for the new group. 
             */
            if (group_stack_level
                > sizeof(group_stack)/sizeof(group_stack[0]))
            {
                /* we cannot proceed - return an error */
                return RE_STATUS_GROUP_NESTING_TOO_DEEP;
            }

            /* save the current state on the stack */
            group_stack[group_stack_level].old_cur = cur_machine;
            group_stack[group_stack_level].old_alter = alter_machine;

            /* 
             *   Assign the group a group ID - groups are numbered in
             *   order of their opening (left) parentheses, so we want to
             *   assign a group number now.  We won't actually need to
             *   know the group number until we get to the matching close
             *   paren, but we need to assign it now, so store it in the
             *   group stack. 
             */
            group_stack[group_stack_level].group_id = ctx->cur_group;

            /* consume the group number */
            ctx->cur_group++;

            /* push the level */
            ++group_stack_level;

            /* start the new group with empty machines */
            re_build_null_machine(ctx, &cur_machine);
            re_build_null_machine(ctx, &alter_machine);
            break;

        case ')':
            /* if there's nothing on the stack, ignore this */
            if (group_stack_level == 0)
                break;

            /* take a level off the stack */
            --group_stack_level;

            /* 
             *   Remove a nesting level.  If we have a pending alternate
             *   expression, build the alternation expression.  This will
             *   leave the entire group expression in alter_machine,
             *   regardless of whether an alternation was in progress or
             *   not.  
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /*
             *   Create a group machine that encloses the group and marks
             *   it with a group number.  We assigned the group number
             *   when we parsed the open paren, so read that group number
             *   from the stack.
             *   
             *   Note that this will leave 'new_machine' with the entire
             *   group machine.  
             */
            re_build_group(ctx, &new_machine, &alter_machine,
                           group_stack[group_stack_level].group_id);

            /*
             *   Pop the stack - restore the alternation and current
             *   machines that were in progress before the group started. 
             */
            cur_machine = group_stack[group_stack_level].old_cur;
            alter_machine = group_stack[group_stack_level].old_alter;

            /*
             *   Check the group expression (in new_machine) for postfix
             *   expressions 
             */
            goto apply_postfix;

        case '|':
            /* 
             *   Start a new alternation.  This ends the current
             *   alternation; if we have a previous pending alternate,
             *   build an alternation machine out of the previous
             *   alternate and the current machine and move that to the
             *   alternate; otherwise, simply move the current machine to
             *   the pending alternate. 
             */
            re_alternate_onto(ctx, &alter_machine, &cur_machine);

            /* 
             *   the alternation starts out with a blank slate, so null
             *   out the current machine 
             */
            re_build_null_machine(ctx, &cur_machine);
            break;

        case '%':
            /* 
             *   quoted character - skip the quote mark and see what we
             *   have 
             */
            ++expr;
            --exprlen;

            /* check to see if we're at the end of the expression */
            if (exprlen == 0)
            {
                /* 
                 *   end of the string - ignore it, but undo the extra
                 *   increment of the expression index so that we exit the
                 *   enclosing loop properly 
                 */
                --expr;
                ++exprlen;
                break;
            }

            /* see what we have */
            switch(*expr)
            {
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
                /* group match - build a new literal group recognizer */
                re_build_group_matcher(ctx, &new_machine, (int)(*expr - '1'));

                /* apply any postfix expression to the group recognizer */
                goto apply_postfix;

            case '<':
                /* build a beginning-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_BEGIN);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case '>':
                /* build an end-of-word recognizer */
                re_build_char(ctx, &new_machine, RE_WORD_END);

                /* it can't be postfixed - just concatenate it */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'w':
                /* word character */
                re_build_char(ctx, &new_machine, RE_WORD_CHAR);
                goto apply_postfix;

            case 'W':
                /* non-word character */
                re_build_char(ctx, &new_machine, RE_NON_WORD_CHAR);
                goto apply_postfix;

            case 'b':
                /* word boundary */
                re_build_char(ctx, &new_machine, RE_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            case 'B':
                /* not a word boundary */
                re_build_char(ctx, &new_machine, RE_NON_WORD_BOUNDARY);

                /* it can't be postfixed */
                re_concat_onto(ctx, &cur_machine, &new_machine);
                break;

            default:
                /* build a new literal character recognizer */
                re_build_char(ctx, &new_machine, *expr);

                /* apply any postfix expression to the character */
                goto apply_postfix;
            }
            break;

        case '.':
            /* 
             *   wildcard character - build a single character recognizer
             *   for the special wildcard symbol, then go check it for a
             *   postfix operator 
             */
            re_build_char(ctx, &new_machine, RE_WILDCARD);
            goto apply_postfix;
            break;

        case '[':
            /* range expression */
            {
                int is_exclusive = FALSE;
                unsigned char set[32];

                /* clear out the set of characters in the range */
                memset(set, 0, sizeof(set));

                /* first, skip the open bracket */
                ++expr;
                --exprlen;

                /* check to see if starts with the exclusion character */
                if (exprlen != 0 && *expr == '^')
                {
                    /* skip the exclusion specifier */
                    ++expr;
                    --exprlen;

                    /* note it */
                    is_exclusive = TRUE;
                }

                /* 
                 *   if the first character is a ']', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == ']')
                {
                    re_set_bit(set, (int)']');
                    ++expr;
                    --exprlen;
                }

                /*
                 *   if the next character is a '-', include it in the
                 *   range 
                 */
                if (exprlen != 0 && *expr == '-')
                {
                    re_set_bit(set, (int)'-');
                    ++expr;
                    --exprlen;
                }

                /* scan the character set */
                while (exprlen != 0 && *expr != ']')
                {
                    int ch;
                    
                    /* note this character */
                    ch = (int)(unsigned char)*expr;

                    /* set it */
                    re_set_bit(set, ch);

                    /* skip this character of the expression */
                    ++expr;
                    --exprlen;

                    /* check for a range */
                    if (exprlen != 0 && *expr == '-')
                    {
                        int ch2;
                        
                        /* skip the '-' */
                        ++expr;
                        --exprlen;
                        if (exprlen != 0)
                        {
                            /* get the other end of the range */
                            ch2 = (int)(unsigned char)*expr;

                            /* skip the second character */
                            ++expr;
                            --exprlen;

                            /* if the range is reversed, swap it */
                            if (ch > ch2)
                            {
                                int tmp = ch;
                                ch = ch2;
                                ch2 = tmp;
                            }

                            /* fill in the range */
                            for ( ; ch <= ch2 ; ++ch)
                                re_set_bit(set, ch);
                        }
                    }
                }

                /* create a character range machine */
                re_build_char_range(ctx, &new_machine, set, is_exclusive);

                /* apply any postfix operator */
                goto apply_postfix;
            }            
            break;

        default:
        normal_char:
            /* 
             *   it's an ordinary character - build a single character
             *   recognizer machine, and then concatenate it onto any
             *   existing machine 
             */
            re_build_char(ctx, &new_machine, *expr);

        apply_postfix:
            /*
             *   Check for a postfix operator, and apply it to the machine
             *   in 'new_machine' if present.  In any case, concatenate
             *   the 'new_machine' (modified by a postix operator or not)
             *   to the current machien.  
             */
            if (exprlen > 1)
            {
                switch(*(expr+1))
                {
                case '*':
                case '+':
                case '?':
                    /*
                     *   We have a postfix closure operator.  Build a new
                     *   closure machine out of 'new_machine'.  
                     */
                    {
                        re_machine closure_machine;
                        
                        /* move onto the closure operator */
                        ++expr;
                        --exprlen;
                        
                        /* build the closure machine */
                        re_build_closure(ctx, &closure_machine,
                                         &new_machine, *expr);
                        
                        /* replace the original machine with the closure */
                        new_machine = closure_machine;
                        
                        /* 
                         *   skip any redundant closure symbols, keeping
                         *   only the first one we saw 
                         */
                        while (exprlen > 1 && (*(expr+1) == '?'
                                               || *(expr+1) == '+'
                                               || *(expr+1) == '*'))
                        {
                            ++expr;
                            --exprlen;
                        }
                    }
                    break;
                    
                default:
                    /* no postfix operator */
                    break;
                }
            }

            /*
             *   Concatenate the new machine onto the current machine
             *   under construction.  
             */
            re_concat_onto(ctx, &cur_machine, &new_machine);
            break;
        }
    }

    /* complete any pending alternation */
    re_alternate_onto(ctx, &alter_machine, &cur_machine);

    /* store the resulting machine in the caller's machine descriptor */
    *result_machine = alter_machine;

    /* no errors encountered */
    return RE_STATUS_SUCCESS;
}